

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIShortDecoder::decode(FIShortDecoder *this,uint8_t *data,size_t len)

{
  ushort uVar1;
  DeadlyImportError *this_00;
  ulong in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ulong uVar3;
  shared_ptr<const_Assimp::FIValue> sVar4;
  vector<short,_std::allocator<short>_> value;
  int16_t v;
  undefined1 local_69;
  vector<short,_std::allocator<short>_> local_68;
  FIShortDecoder local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if ((in_RCX & 1) == 0) {
    local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = (short *)0x0;
    local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (short *)0x0;
    std::vector<short,_std::allocator<short>_>::reserve(&local_68,in_RCX >> 1);
    if (in_RCX != 0) {
      uVar3 = 0;
      do {
        uVar1 = *(ushort *)(len + uVar3 * 2);
        uVar1 = uVar1 << 8 | uVar1 >> 8;
        local_48._0_2_ = uVar1;
        if (local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                    ((vector<short,std::allocator<short>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_finish,(short *)&local_48);
        }
        else {
          *local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar1;
          local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_finish = local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
        }
        uVar3 = uVar3 + 1;
      } while (in_RCX >> 1 != uVar3);
    }
    local_48 = (FIShortDecoder)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::FIShortValueImpl,std::allocator<Assimp::FIShortValueImpl>,std::vector<short,std::allocator<short>>>
              (a_Stack_40,(FIShortValueImpl **)&local_48,
               (allocator<Assimp::FIShortValueImpl> *)&local_69,&local_68);
    *this = local_48;
    this[1] = (FIShortDecoder)a_Stack_40[0]._M_pi;
    _Var2._M_pi = extraout_RDX;
    if (local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start);
      _Var2._M_pi = extraout_RDX_00;
    }
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<int16_t> value;
        size_t numShorts = len / 2;
        value.reserve(numShorts);
        for (size_t i = 0; i < numShorts; ++i) {
            int16_t v = (data[0] << 8) | data[1];
            value.push_back(v);
            data += 2;
        }
        return FIShortValue::create(std::move(value));
    }